

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usecase_test.cc
# Opt level: O0

void __thiscall
FileHandlePool::FileHandlePool
          (FileHandlePool *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *filenames,int count)

{
  fdb_status _index;
  PoolEntry *this_00;
  reference file;
  void *pvVar1;
  int in_EDX;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RSI;
  undefined8 *in_RDI;
  PoolEntry *pe;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  int i;
  fdb_kvs_config kvs_config;
  fdb_config fconfig;
  fdb_status status;
  fdb_kvs_handle *in_stack_fffffffffffffe68;
  fdb_file_handle *in_stack_fffffffffffffe70;
  fdb_status in_stack_fffffffffffffe78;
  StatAggregator *this_01;
  int local_13c;
  
  *in_RDI = &PTR__FileHandlePool_001a1ce0;
  this_01 = (StatAggregator *)(in_RDI + 1);
  std::vector<PoolEntry_*,_std::allocator<PoolEntry_*>_>::vector
            ((vector<PoolEntry_*,_std::allocator<PoolEntry_*>_> *)0x106898);
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  for (local_13c = 0; local_13c < in_EDX; local_13c = local_13c + 1) {
    this_00 = (PoolEntry *)(long)local_13c;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::size(in_RSI);
    file = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffe70,(size_type)in_stack_fffffffffffffe68);
    std::__cxx11::string::c_str();
    _index = fdb_open((fdb_file_handle **)fconfig.wal_threshold,(char *)fconfig.buffercache_size,
                      (fdb_config *)fconfig._0_8_);
    if (_index != FDB_RESULT_SUCCESS) {
      fdb_assert_die((char *)in_RSI,(char *)file,(int)((ulong)this_00 >> 0x20),
                     CONCAT44(_index,in_stack_fffffffffffffe78),(uint64_t)in_stack_fffffffffffffe70)
      ;
    }
    in_stack_fffffffffffffe78 =
         fdb_kvs_open_default
                   (in_stack_fffffffffffffe70,(fdb_kvs_handle **)in_stack_fffffffffffffe68,
                    (fdb_kvs_config *)0x106982);
    if (in_stack_fffffffffffffe78 != FDB_RESULT_SUCCESS) {
      fdb_assert_die((char *)in_RSI,(char *)file,(int)((ulong)this_00 >> 0x20),
                     CONCAT44(_index,in_stack_fffffffffffffe78),(uint64_t)in_stack_fffffffffffffe70)
      ;
    }
    in_stack_fffffffffffffe70 = (fdb_file_handle *)operator_new(0x18);
    PoolEntry::PoolEntry
              (this_00,_index,SUB41((uint)in_stack_fffffffffffffe78 >> 0x18,0),
               in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
    std::vector<PoolEntry_*,_std::allocator<PoolEntry_*>_>::push_back
              ((vector<PoolEntry_*,_std::allocator<PoolEntry_*>_> *)this_00,
               (value_type *)CONCAT44(_index,in_stack_fffffffffffffe78));
  }
  pthread_mutex_init((pthread_mutex_t *)(in_RDI + 6),(pthread_mutexattr_t *)0x0);
  pvVar1 = operator_new(0x10);
  StatAggregator::StatAggregator(this_01,(int)((ulong)in_RDI >> 0x20),(int)in_RDI);
  in_RDI[5] = pvVar1;
  std::__cxx11::string::operator=((string *)**(undefined8 **)in_RDI[5],"set");
  std::__cxx11::string::operator=(*(string **)(*(long *)in_RDI[5] + 8),"commit");
  std::__cxx11::string::operator=(*(string **)(*(long *)in_RDI[5] + 0x10),"get");
  std::__cxx11::string::operator=(*(string **)(*(long *)in_RDI[5] + 0x18),"in-mem snapshot");
  std::__cxx11::string::operator=(*(string **)(*(long *)in_RDI[5] + 0x28),"iterator-init");
  std::__cxx11::string::operator=(*(string **)(*(long *)in_RDI[5] + 0x38),"iterator-get");
  std::__cxx11::string::operator=(*(string **)(*(long *)in_RDI[5] + 0x40),"iterator-close");
  *(undefined4 *)(in_RDI + 4) = 0;
  return;
}

Assistant:

FileHandlePool(std::vector<std::string> filenames, int count) {
        fdb_status status;
        fdb_config fconfig = fdb_get_default_config();
        fconfig.multi_kv_instances = false;
        fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
        for (int i = 0; i < count; ++i) {
            fdb_file_handle *dbfile;
            fdb_kvs_handle *db;
            status = fdb_open(&dbfile,
                              filenames.at(i % filenames.size()).c_str(),
                              &fconfig);
            fdb_assert(status == FDB_RESULT_SUCCESS, status, FDB_RESULT_SUCCESS);
            status = fdb_kvs_open_default(dbfile, &db, &kvs_config);
            fdb_assert(status == FDB_RESULT_SUCCESS, status, FDB_RESULT_SUCCESS);
            PoolEntry *pe = new PoolEntry(i, true, dbfile, db);
            pool_vector.push_back(pe);
        }

        mutex_init(&statlock);

        // Set up StatAggregator
        sa = new StatAggregator(_num_stats_, 1);

        sa->t_stats[SET][0].name = "set";
        sa->t_stats[COMMIT][0].name = "commit";
        sa->t_stats[GET][0].name = "get";
        sa->t_stats[IN_MEM_SNAP][0].name = "in-mem snapshot";

        sa->t_stats[ITR_INIT][0].name = "iterator-init";
        sa->t_stats[ITR_GET][0].name = "iterator-get";
        sa->t_stats[ITR_CLOSE][0].name = "iterator-close";

        samples = 0;
    }